

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus ZyanVectorReallocate(ZyanVector *vector,ZyanUSize capacity)

{
  ZyanUSize ZStack_20;
  ZyanStatus status_047620348;
  ZyanUSize capacity_local;
  ZyanVector *vector_local;
  
  if (vector == (ZyanVector *)0x0) {
    __assert_fail("vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                  ,0x56,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
  }
  if (vector->capacity == 0) {
    __assert_fail("vector->capacity >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                  ,0x57,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
  }
  if (vector->element_size == 0) {
    __assert_fail("vector->element_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                  ,0x58,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
  }
  if (vector->data != (void *)0x0) {
    if (vector->allocator == (ZyanAllocator *)0x0) {
      if (vector->capacity < capacity) {
        vector_local._4_4_ = 0x80100009;
      }
      else {
        vector_local._4_4_ = 0x100000;
      }
    }
    else {
      if (vector->allocator == (ZyanAllocator *)0x0) {
        __assert_fail("vector->allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                      ,100,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
      }
      if (vector->allocator->reallocate == (ZyanAllocatorAllocate)0x0) {
        __assert_fail("vector->allocator->reallocate",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                      ,0x65,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
      }
      ZStack_20 = capacity;
      if (capacity == 0) {
        if (vector->capacity < 2) {
          return 0x100000;
        }
        ZStack_20 = 1;
      }
      vector->capacity = ZStack_20;
      vector_local._4_4_ =
           (*vector->allocator->reallocate)
                     (vector->allocator,&vector->data,vector->element_size,vector->capacity);
      if ((vector_local._4_4_ & 0x80000000) == 0) {
        vector_local._4_4_ = 0x100000;
      }
    }
    return vector_local._4_4_;
  }
  __assert_fail("vector->data",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                ,0x59,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
}

Assistant:

static ZyanStatus ZyanVectorReallocate(ZyanVector* vector, ZyanUSize capacity)
{
    ZYAN_ASSERT(vector);
    ZYAN_ASSERT(vector->capacity >= ZYAN_VECTOR_MIN_CAPACITY);
    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    if (!vector->allocator)
    {
        if (vector->capacity < capacity)
        {
            return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
        }
        return ZYAN_STATUS_SUCCESS;
    }

    ZYAN_ASSERT(vector->allocator);
    ZYAN_ASSERT(vector->allocator->reallocate);

    if (capacity < ZYAN_VECTOR_MIN_CAPACITY)
    {
        if (vector->capacity > ZYAN_VECTOR_MIN_CAPACITY)
        {
            capacity = ZYAN_VECTOR_MIN_CAPACITY;
        } else
        {
            return ZYAN_STATUS_SUCCESS;
        }
    }

    vector->capacity = capacity;
    ZYAN_CHECK(vector->allocator->reallocate(vector->allocator, &vector->data,
        vector->element_size, vector->capacity));

    return ZYAN_STATUS_SUCCESS;
}